

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool>
               (int *ldata,int *rdata,int *result_data,SelectionVector *lsel,SelectionVector *rsel,
               idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  int iVar2;
  idx_t iVar3;
  SelectionVector *in_RCX;
  long in_RDX;
  ValidityMask *in_RSI;
  idx_t in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  int rentry_1;
  int lentry_1;
  idx_t i_1;
  int rentry;
  int lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff88;
  idx_t idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  ValidityMask *mask;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  ulong idx_00;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(_rentry_1), bVar1)) {
    for (idx_00 = 0; idx_00 < in_R9; idx_00 = idx_00 + 1) {
      idx = in_RDI;
      iVar3 = SelectionVector::get_index(in_RCX,idx_00);
      iVar2 = *(int *)(idx + iVar3 * 4);
      mask = in_RSI;
      SelectionVector::get_index(in_R8,idx_00);
      iVar2 = BinaryStandardOperatorWrapper::Operation<bool,duckdb::MultiplyOperator,int,int,int>
                        (SUB81(idx_00 >> 0x38,0),(int)idx_00,iVar2,mask,idx);
      *(int *)(in_RDX + idx_00 * 4) = iVar2;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (idx_t)in_stack_ffffffffffffff90);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (idx_t)in_stack_ffffffffffffff90), bVar1)) {
        iVar2 = BinaryStandardOperatorWrapper::Operation<bool,duckdb::MultiplyOperator,int,int,int>
                          (SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0),
                           (int)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                           (ValidityMask *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        *(int *)(in_RDX + local_40 * 4) = iVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}